

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chorus.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_124ac1::ChorusState::deviceUpdate(ChorusState *this,ALCdevice *Device)

{
  pointer pfVar1;
  uint32_t uVar2;
  pointer pfVar3;
  anon_struct_128_2_952b89bb *paVar4;
  pointer pfVar5;
  long lVar6;
  float *pfVar7;
  long lVar8;
  allocator_type local_29;
  _Vector_base<float,_al::allocator<float,_16UL>_> local_28;
  
  uVar2 = NextPowerOf2((int)((float)Device->Frequency * 0.032) + 1);
  pfVar3 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar5 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pfVar5 - (long)pfVar3 >> 2 != (ulong)uVar2) {
    std::vector<float,_al::allocator<float,_16UL>_>::vector
              ((vector<float,_al::allocator<float,_16UL>_> *)&local_28,(ulong)uVar2,&local_29);
    pfVar5 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar1 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar3 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
    super__Vector_impl_data._M_start = local_28._M_impl.super__Vector_impl_data._M_start;
    (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
    super__Vector_impl_data._M_finish = local_28._M_impl.super__Vector_impl_data._M_finish;
    (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_28._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_28._M_impl.super__Vector_impl_data._M_start = pfVar5;
    local_28._M_impl.super__Vector_impl_data._M_finish = pfVar1;
    local_28._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar3;
    std::_Vector_base<float,_al::allocator<float,_16UL>_>::~_Vector_base(&local_28);
    pfVar3 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar5 = (this->mSampleBuffer).super__Vector_base<float,_al::allocator<float,_16UL>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  for (; pfVar3 != pfVar5; pfVar3 = pfVar3 + 1) {
    *pfVar3 = 0.0;
  }
  paVar4 = this->mGains;
  pfVar7 = this->mGains[0].Target;
  for (lVar6 = 0x4c; lVar6 != 0x14c; lVar6 = lVar6 + 0x80) {
    for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 4) {
      *(undefined4 *)((long)paVar4->Current + lVar8) = 0;
    }
    for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 4) {
      *(undefined4 *)((long)pfVar7 + lVar8) = 0;
    }
    paVar4 = paVar4 + 1;
    pfVar7 = pfVar7 + 0x20;
  }
  return;
}

Assistant:

void ChorusState::deviceUpdate(const ALCdevice *Device)
{
    constexpr float max_delay{maxf(AL_CHORUS_MAX_DELAY, AL_FLANGER_MAX_DELAY)};

    const auto frequency = static_cast<float>(Device->Frequency);
    const size_t maxlen{NextPowerOf2(float2uint(max_delay*2.0f*frequency) + 1u)};
    if(maxlen != mSampleBuffer.size())
        al::vector<float,16>(maxlen).swap(mSampleBuffer);

    std::fill(mSampleBuffer.begin(), mSampleBuffer.end(), 0.0f);
    for(auto &e : mGains)
    {
        std::fill(std::begin(e.Current), std::end(e.Current), 0.0f);
        std::fill(std::begin(e.Target), std::end(e.Target), 0.0f);
    }
}